

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

void boost::filesystem::detail::last_write_time(path *p,time_t new_time,error_code *ec)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  utimbuf buf;
  stat path_stat;
  utimbuf local_b8;
  stat64 local_a8;
  
  iVar2 = stat64((p->m_pathname)._M_dataplus._M_p,&local_a8);
  bVar1 = anon_unknown.dwarf_59d9::error
                    ((uint)(iVar2 != 0),p,ec,"boost::filesystem::last_write_time");
  if (!bVar1) {
    local_b8.actime = local_a8.st_atim.tv_sec;
    local_b8.modtime = new_time;
    iVar2 = utime((p->m_pathname)._M_dataplus._M_p,&local_b8);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
    }
    anon_unknown.dwarf_59d9::error(iVar2,p,ec,"boost::filesystem::last_write_time");
  }
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void last_write_time(const path& p, const std::time_t new_time,
                        system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (error(::stat(p.c_str(), &path_stat)!= 0,
      p, ec, "boost::filesystem::last_write_time"))
        return;
    ::utimbuf buf;
    buf.actime = path_stat.st_atime; // utime()updates access time too:-(
    buf.modtime = new_time;
    error(::utime(p.c_str(), &buf)!= 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time");

#   else

    handle_wrapper hw(
      create_file_handle(p.c_str(), FILE_WRITE_ATTRIBUTES,
        FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE, 0,
        OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0));

    if (error(hw.handle == INVALID_HANDLE_VALUE ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return;

    FILETIME lwt;
    to_FILETIME(new_time, lwt);

    error(::SetFileTime(hw.handle, 0, 0, &lwt)== 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time");
#   endif
  }